

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

void __thiscall despot::BaseTag::PrintTransitions(BaseTag *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ostream *poVar4;
  undefined8 uVar5;
  int i;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  
  uVar8 = 0;
  while( true ) {
    iVar3 = (**(code **)(*(long *)this + 0x10))(this);
    if ((long)iVar3 <= (long)uVar8) break;
    poVar4 = std::operator<<((ostream *)&std::cout,"State ");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(int)uVar8);
    std::endl<char,std::char_traits<char>>(poVar4);
    uVar5 = (**(code **)(*(long *)this + 0x60))(this,uVar8 & 0xffffffff);
    (**(code **)(*(long *)this + 0xc0))(this,uVar5,&std::cout);
    lVar7 = 0;
    while( true ) {
      iVar3 = (**(code **)(*(long *)this + 0x18))(this);
      if (iVar3 <= lVar7) break;
      poVar4 = std::operator<<((ostream *)&std::cout,"Applying action ");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(int)lVar7);
      poVar4 = std::operator<<(poVar4," on ");
      std::endl<char,std::char_traits<char>>(poVar4);
      lVar9 = 0xc;
      for (uVar6 = 0;
          lVar1 = *(long *)&(this->transition_probabilities_).
                            super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar8].
                            super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                            ._M_impl.super__Vector_impl_data,
          lVar2 = *(long *)(lVar1 + lVar7 * 0x18),
          uVar6 < (ulong)(*(long *)(lVar1 + 8 + lVar7 * 0x18) - lVar2 >> 5); uVar6 = uVar6 + 1) {
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar8);
        poVar4 = std::operator<<(poVar4,"-");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(int)lVar7);
        poVar4 = std::operator<<(poVar4,"-");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,*(int *)(lVar2 + lVar9));
        std::operator<<(poVar4,"-");
        poVar4 = std::ostream::_M_insert<double>(*(double *)(lVar2 + 0xc + lVar9));
        std::endl<char,std::char_traits<char>>(poVar4);
        uVar5 = (**(code **)(*(long *)this + 0x60))(this,*(undefined4 *)(lVar2 + lVar9));
        (**(code **)(*(long *)this + 0xc0))(this,uVar5,&std::cout);
        lVar9 = lVar9 + 0x20;
      }
      lVar7 = lVar7 + 1;
    }
    uVar8 = uVar8 + 1;
  }
  return;
}

Assistant:

void BaseTag::PrintTransitions() const {
	for (int s = 0; s < NumStates(); s++) {
		cout << "State " << s << endl;
		PrintState(*GetState(s));
		for (int a = 0; a < NumActions(); a++) {
			cout << "Applying action " << a << " on " << endl;
			for (int i = 0; i < transition_probabilities_[s][a].size();
				i++) {
				const State& next = transition_probabilities_[s][a][i];
				cout << s << "-" << a << "-" << next.state_id << "-"
					<< next.weight << endl;
				PrintState(*GetState(next.state_id));
			}
		}
	}
}